

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlb.c
# Opt level: O0

int lib_dlb_fread(char *buf,int size,int quan,dlb *dp)

{
  long __off;
  size_t sVar1;
  long nbytes;
  long nread;
  long pos;
  dlb *dp_local;
  int quan_local;
  int size_local;
  char *buf_local;
  
  dp_local._0_4_ = quan;
  if (dp->size - dp->mark < (long)(size * quan)) {
    dp_local._0_4_ = (int)((dp->size - dp->mark) / (long)size);
  }
  if ((int)dp_local == 0) {
    buf_local._4_4_ = 0;
  }
  else {
    __off = dp->start + dp->mark;
    if (dp->lib->fmark != __off) {
      fseek((FILE *)dp->lib->fdata,__off,0);
      dp->lib->fmark = __off;
    }
    sVar1 = fread(buf,(long)size,(long)(int)dp_local,(FILE *)dp->lib->fdata);
    dp->mark = sVar1 * (long)size + dp->mark;
    dp->lib->fmark = sVar1 * (long)size + dp->lib->fmark;
    buf_local._4_4_ = (int)sVar1;
  }
  return buf_local._4_4_;
}

Assistant:

static int lib_dlb_fread(char *buf, int size, int quan, dlb *dp)
{
    long pos, nread, nbytes;

    /* make sure we don't read into the next file */
    if ((dp->size - dp->mark) < (size * quan))
	quan = (dp->size - dp->mark) / size;
    if (quan == 0) return 0;

    pos = dp->start + dp->mark;
    if (dp->lib->fmark != pos) {
	fseek(dp->lib->fdata, pos, SEEK_SET);	/* check for error??? */
	dp->lib->fmark = pos;
    }

    nread = fread(buf, size, quan, dp->lib->fdata);
    nbytes = nread * size;
    dp->mark += nbytes;
    dp->lib->fmark += nbytes;

    return nread;
}